

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::CheckResourcesAvailable(cmCTestMultiProcessHandler *this)

{
  int index;
  bool bVar1;
  reference piVar2;
  mapped_type *errors;
  undefined1 local_60 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  allocations;
  iterator iStack_28;
  int test;
  iterator __end2;
  iterator __begin2;
  TestList *__range2;
  cmCTestMultiProcessHandler *this_local;
  
  if ((this->TestHandler->UseResourceSpec & 1U) != 0) {
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       (&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
    iStack_28 = std::vector<int,_std::allocator<int>_>::end
                          (&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd8), bVar1) {
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      allocations._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *piVar2;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
             *)local_60);
      index = allocations._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      errors = std::
               map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
               ::operator[](&this->ResourceAllocationErrors,
                            (key_type_conflict *)
                            ((long)&allocations._M_t._M_impl.super__Rb_tree_header._M_node_count + 4
                            ));
      TryAllocateResources
                (this,index,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
                  *)local_60,errors);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
              *)local_60);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResourcesAvailable()
{
  if (this->TestHandler->UseResourceSpec) {
    for (auto test : this->SortedTests) {
      std::map<std::string, std::vector<cmCTestBinPackerAllocation>>
        allocations;
      this->TryAllocateResources(test, allocations,
                                 &this->ResourceAllocationErrors[test]);
    }
  }
}